

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool util::compareString(string *str1,string *str2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  int local_24;
  int i;
  string *str2_local;
  string *str1_local;
  
  lVar3 = std::__cxx11::string::size();
  lVar4 = std::__cxx11::string::size();
  if (lVar3 == lVar4) {
    for (local_24 = 0; uVar5 = std::__cxx11::string::size(), (ulong)(long)local_24 < uVar5;
        local_24 = local_24 + 1) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)str1);
      iVar1 = tolower((int)*pcVar6);
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)str2);
      iVar2 = tolower((int)*pcVar6);
      if (iVar1 != iVar2) {
        return false;
      }
    }
    str1_local._7_1_ = true;
  }
  else {
    str1_local._7_1_ = false;
  }
  return str1_local._7_1_;
}

Assistant:

bool util::compareString(const string &str1, const string &str2){
    if(str1.size() != str2.size())
        return false;
    for(int i = 0; i < str1.size(); i++)
        if(tolower(str1[i]) != tolower(str2[i]))
            return false;
    return true;
}